

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O2

VOID __thiscall
CorUnix::CThreadSuspensionInfo::ReleaseSuspensionLocks
          (CThreadSuspensionInfo *this,CPalThread *pthrSuspender,CPalThread *pthrTarget)

{
  CThreadSuspensionInfo *this_00;
  
  this_00 = (CThreadSuspensionInfo *)&pthrTarget->synchronizationInfo;
  CThreadSynchronizationInfo::ReleaseNativeWaitLock((CThreadSynchronizationInfo *)this_00);
  ReleaseSuspensionLock(this_00,pthrTarget);
  ReleaseSuspensionLock(this_00,pthrSuspender);
  return;
}

Assistant:

VOID
CThreadSuspensionInfo::ReleaseSuspensionLocks(
    CPalThread *pthrSuspender,
    CPalThread *pthrTarget
    )
{
    // See comment in AcquireSuspensionLocks
    pthrTarget->ReleaseNativeWaitLock();

#ifdef USE_GLOBAL_LOCK_FOR_SUSPENSION
    ReleaseSuspensionLock(pthrSuspender);
#else // USE_GLOBAL_LOCK_FOR_SUSPENSION
    ReleaseSuspensionLock(pthrTarget);
    ReleaseSuspensionLock(pthrSuspender);
#endif // USE_GLOBAL_LOCK_FOR_SUSPENSION
}